

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_dss_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  int iVar1;
  
  if (sig_len == 0x37) {
    iVar1 = _libssh2_dsa_sha1_verify((DSA *)*abstract,sig + 0xf,m,m_len);
    return iVar1;
  }
  iVar1 = _libssh2_error(session,-0xe,"Invalid DSS signature length");
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_dss_sig_verify(LIBSSH2_SESSION * session,
                                  const unsigned char *sig,
                                  size_t sig_len,
                                  const unsigned char *m,
                                  size_t m_len, void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);

    /* Skip past keyname_len(4) + keyname(7){"ssh-dss"} + signature_len(4) */
    if(sig_len != 55) {
        return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                              "Invalid DSS signature length");
    }

    sig += 15;
    sig_len -= 15;

    return _libssh2_dsa_sha1_verify(dsactx, sig, m, m_len);
}